

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O2

void __thiscall
amrex::FABio_ascii::skip(FABio_ascii *this,istream *param_1,FArrayBox *param_2,int param_3)

{
  Error_host("FABio_ascii::skip(..., int nCompToSkip) not implemented");
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Error (const char* msg = 0) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Error %s\n", msg);
        AMREX_DEVICE_ASSERT(0);
#endif
#else
        Error_host(msg);
#endif
    }